

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  long v1;
  uint32_t uVar1;
  bool bVar2;
  char *pcVar3;
  Nonnull<const_char_*> pcVar4;
  ulong uVar5;
  int iVar6;
  long v1_00;
  char cVar7;
  int iVar8;
  char *pcVar9;
  
  if (this->unknown_ != (string *)0x0) {
    uVar5 = (ulong)(num * 8 + 3);
    cVar7 = (char)this->unknown_;
    if (0x7f < num * 8) {
      do {
        std::__cxx11::string::push_back(cVar7);
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar5 >> 7;
      } while (bVar2);
    }
    std::__cxx11::string::push_back(cVar7);
  }
  iVar6 = ctx->depth_;
  v1 = (long)iVar6 + -1;
  iVar8 = (int)v1;
  ctx->depth_ = iVar8;
  if ((long)iVar6 < 1) {
    pcVar9 = (char *)0x0;
  }
  else {
    v1_00 = (long)ctx->group_depth_ + 1;
    iVar6 = (int)v1_00;
    ctx->group_depth_ = iVar6;
    pcVar3 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    if (pcVar3 != (char *)0x0) {
      if (iVar8 == ctx->depth_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,(long)ctx->depth_,"old_depth == depth_");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
        ParseGroup();
LAB_002b1ffa:
        ParseGroup();
      }
      if (iVar6 == ctx->group_depth_) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1_00,(long)ctx->group_depth_,"old_group_depth == group_depth_");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) goto LAB_002b1ffa;
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar1 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar9 = (char *)0x0;
    if (uVar1 == num * 8 + 3) {
      pcVar9 = pcVar3;
    }
  }
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else if (this->unknown_ != (string *)0x0) {
    uVar5 = (ulong)(num << 3 | 4);
    cVar7 = (char)this->unknown_;
    if (0x7f < num << 3) {
      do {
        std::__cxx11::string::push_back(cVar7);
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar5 >> 7;
      } while (bVar2);
    }
    std::__cxx11::string::push_back(cVar7);
  }
  return pcVar9;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }